

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  string *psVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  char *pcVar4;
  pointer pbVar5;
  cmCTestRunTest *pcVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  ostream *poVar12;
  time_point tVar13;
  long lVar14;
  string *psVar15;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong *puVar18;
  _Rb_tree_header *p_Var19;
  pointer pbVar20;
  cmDuration testTimeOut;
  double dVar21;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string testName;
  ostringstream cmCTestLog_msg;
  ulong *local_200;
  char *local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  string *local_1e0;
  string local_1d8;
  cmCTestRunTest *local_1b8;
  cmCTestTestProperties *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar7) {
    GetTestPrefix_abi_cxx11_(&local_1d8,this,completed,total);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d8,
                                (ulong)(this->TestProperties->Name)._M_dataplus._M_p);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar17) {
      local_198._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_198._8_8_ = plVar9[3];
      local_1a8._0_8_ = &local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_1a8._8_8_ = plVar9[1];
    *plVar9 = (long)paVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_1a8);
    puVar18 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar18) {
      local_1f0 = *puVar18;
      lStack_1e8 = plVar9[3];
      local_200 = &local_1f0;
    }
    else {
      local_1f0 = *puVar18;
      local_200 = (ulong *)*plVar9;
    }
    local_1f8 = (char *)plVar9[1];
    *plVar9 = (long)puVar18;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_200,(long)local_1f8);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20f,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar10 = 10;
    if (9 < total) {
      uVar16 = 10;
      do {
        uVar16 = uVar16 + 2;
        bVar7 = 99 < total;
        total = total / 10;
      } while (bVar7);
      uVar10 = (ulong)uVar16;
    }
    *(ulong *)((long)&local_198 + *(size_type *)(local_1a8._0_8_ + -0x18)) = uVar10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
    uVar10 = (ulong)this->TestHandler->MaxIndex;
    lVar14 = 1;
    if (9 < uVar10) {
      do {
        lVar14 = lVar14 + 1;
        bVar7 = 99 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar7);
    }
    *(long *)((long)&local_198 + *(size_type *)(local_1a8._0_8_ + -0x18)) = lVar14;
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20b,(char *)local_200,false);
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  pcVar3 = this->TestProperties;
  (this->TestResult).Properties = pcVar3;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = pcVar3->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  pcVar4 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  psVar1 = &(this->TestResult).CompletionStatus;
  if (this->TestProperties->Disabled == true) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x7576fa);
    (this->TestResult).Status = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).Output,0,
               (char *)(this->TestResult).Output._M_string_length,0x7576fa);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (this->TestResult).Environment._M_string_length = 0;
    *(this->TestResult).Environment._M_dataplus._M_p = '\0';
    return false;
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x75bea9);
  (this->TestResult).Status = 8;
  local_1e0 = psVar1;
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ComputeArguments(this);
    local_1b0 = this->TestProperties;
    pbVar20 = (local_1b0->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(local_1b0->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x21) ||
       (iVar8 = std::__cxx11::string::compare((char *)(pbVar20 + 1)), iVar8 != 0)) {
      pbVar20 = (this->TestProperties->RequiredFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (this->TestProperties->RequiredFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 != pbVar5) {
        local_1b8 = (cmCTestRunTest *)&(this->TestResult).Output;
        do {
          bVar7 = cmsys::SystemTools::FileExists(pbVar20);
          if (!bVar7) {
            poVar12 = this->TestHandler->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"Unable to find required file: ",0x1e);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pbVar20->_M_dataplus)._M_p,pbVar20->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(pbVar20->_M_dataplus)._M_p,
                                 pbVar20->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                         ,600,(char *)local_200,false);
            if (local_200 != &local_1f0) {
              operator_delete(local_200,local_1f0 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"Unable to find required file: ",pbVar20);
            std::__cxx11::string::operator=((string *)local_1b8,(string *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
            }
            (this->TestResult).FullCommandLine._M_string_length = 0;
            *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
            (this->TestResult).Environment._M_string_length = 0;
            *(this->TestResult).Environment._M_dataplus._M_p = '\0';
            std::__cxx11::string::_M_replace
                      ((ulong)local_1e0,0,
                       (char *)(this->TestResult).CompletionStatus._M_string_length,0x75bf8c);
            (this->TestResult).Status = 0;
            if (!bVar7) {
              return false;
            }
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != pbVar5);
      }
      if ((this->ActualCommand)._M_string_length == 0) {
        poVar12 = this->TestHandler->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Unable to find executable: ",0x1b);
        pcVar3 = local_1b0;
        pbVar20 = (local_1b0->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,pbVar20[1]._M_dataplus._M_p,pbVar20[1]._M_string_length);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
        pbVar20 = (pcVar3->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pbVar20[1]._M_dataplus._M_p,
                             pbVar20[1]._M_string_length);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        psVar1 = local_1e0;
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x268,(char *)local_200,false);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Unable to find executable: ",
                       (pcVar3->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        (this->TestResult).Environment._M_string_length = 0;
        *(this->TestResult).Environment._M_dataplus._M_p = '\0';
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                   0x75bfbf);
        (this->TestResult).Status = 0;
        return false;
      }
      cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      local_1e0 = (string *)(this->TestProperties->Timeout).__r;
      this->TimeoutIsForStopTime = false;
      tVar13 = cmCTest::GetStopTime(this->CTest);
      testTimeOut.__r = (rep_conflict)local_1e0;
      if (tVar13.__d.__r != 0) {
        lVar14 = std::chrono::_V2::system_clock::now();
        dVar21 = (double)(((long)tVar13.__d.__r - lVar14) % 86400000000000) / 1000000000.0;
        if (dVar21 <= 0.0) {
          dVar21 = 0.0;
        }
        if ((((double)local_1e0 == 0.0) && (!NAN((double)local_1e0))) ||
           (testTimeOut.__r = (rep_conflict)local_1e0, dVar21 < (double)local_1e0)) {
          this->TimeoutIsForStopTime = true;
          testTimeOut.__r = dVar21;
        }
      }
      pcVar3 = this->TestProperties;
      bVar7 = ForkProcess(this,testTimeOut,pcVar3->ExplicitTimeout,&pcVar3->Environment,
                          &pcVar3->EnvironmentModification,&pcVar3->Affinity);
      return bVar7;
    }
    local_1f8 = (char *)0x0;
    local_1f0 = local_1f0 & 0xffffffffffffff00;
    local_200 = &local_1f0;
    psVar15 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar15->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x75beed);
    }
    else {
      psVar15 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      local_198._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_198._M_allocated_capacity = psVar15->_M_string_length;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x25;
      local_1a8._8_8_ = "Test not available in configuration \"";
      local_188 = 2;
      local_180 = "\".";
      views._M_len = 3;
      views._M_array = (iterator)local_1a8;
      cmCatViews_abi_cxx11_(&local_1d8,views);
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (this->TestHandler->LogFile,(char *)local_200,(long)local_1f8);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_200,(long)local_1f8);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x248,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (this->TestResult).Environment._M_string_length = 0;
    *(this->TestResult).Environment._M_dataplus._M_p = '\0';
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,0x75bf57
              );
    (this->TestResult).Status = 0;
    if (local_200 == &local_1f0) {
      return false;
    }
  }
  else {
    local_200 = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"Failed test dependencies:","");
    p_Var11 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var19 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
    local_1b8 = this;
    if ((_Rb_tree_header *)p_Var11 != p_Var19) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
        std::__cxx11::string::_M_append((char *)&local_200,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var19);
    }
    pcVar6 = local_1b8;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b8->TestHandler->LogFile,(char *)local_200,(long)local_1f8);
    psVar1 = local_1e0;
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_200,(long)local_1f8);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar2 = pcVar6->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x233,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(pcVar6->TestResult).Output);
    (pcVar6->TestResult).FullCommandLine._M_string_length = 0;
    *(pcVar6->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (pcVar6->TestResult).Environment._M_string_length = 0;
    *(pcVar6->TestResult).Environment._M_dataplus._M_p = '\0';
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(pcVar6->TestResult).CompletionStatus._M_string_length,
               0x75bed3);
    (pcVar6->TestResult).Status = 0;
    if (local_200 == &local_1f0) {
      return false;
    }
  }
  operator_delete(local_200,local_1f0 + 1);
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName = this->GetTestPrefix(completed, total) +
      this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.  (Missing \"-C "
            "<config>\"?)";
    } else {
      msg = cmStrCat("Test not available in configuration \"",
                     this->CTest->GetConfigType(), "\".");
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.Environment.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->EnvironmentModification,
                           &this->TestProperties->Affinity);
}